

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O3

void aalcalcmeanonly::ReadFilesInDirectory(string *path)

{
  pointer pcVar1;
  int iVar2;
  DIR *__dirp;
  dirent *pdVar3;
  size_t sVar4;
  FILE *__stream;
  undefined8 extraout_RAX;
  int summarySet;
  int summaryCalcStreamType;
  string s;
  undefined4 local_7c;
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  string *local_58;
  char *local_50;
  ulong local_48;
  char local_40 [16];
  
  local_58 = path;
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    pdVar3 = readdir(__dirp);
    if (pdVar3 != (dirent *)0x0) {
      do {
        local_50 = local_40;
        sVar4 = strlen(pdVar3->d_name);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,pdVar3->d_name,pdVar3->d_name + sVar4);
        if (4 < local_48) {
          std::__cxx11::string::substr((ulong)local_78,(ulong)&local_50);
          iVar2 = std::__cxx11::string::compare((char *)local_78);
          if (local_78[0] != local_68) {
            operator_delete(local_78[0]);
          }
          if (iVar2 == 0) {
            local_78[0] = local_68;
            pcVar1 = (local_58->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_78,pcVar1,pcVar1 + local_58->_M_string_length);
            std::__cxx11::string::append((char *)local_78);
            std::__cxx11::string::operator=((string *)&local_50,(string *)local_78);
            if (local_78[0] != local_68) {
              operator_delete(local_78[0]);
            }
            __stream = fopen(local_50,"rb");
            if (__stream == (FILE *)0x0) {
LAB_00102a68:
              ReadFilesInDirectory((aalcalcmeanonly *)&local_50);
              if (local_50 != local_40) {
                operator_delete(local_50);
              }
              _Unwind_Resume(extraout_RAX);
            }
            local_78[0] = (undefined1 *)((ulong)local_78[0] & 0xffffffff00000000);
            fread((string *)local_78,4,1,__stream);
            if ((int)local_78[0] != 0x3000001) {
              ReadFilesInDirectory((aalcalcmeanonly *)((ulong)local_78[0] & 0xffffffff));
              goto LAB_00102a68;
            }
            fread(&sampleSize_,4,1,__stream);
            local_7c = 0;
            fread(&local_7c,4,1,__stream);
            ReadInputStream((FILE *)__stream);
            fclose(__stream);
          }
        }
        if (local_50 != local_40) {
          operator_delete(local_50);
        }
        pdVar3 = readdir(__dirp);
      } while (pdVar3 != (dirent *)0x0);
    }
  }
  return;
}

Assistant:

void ReadFilesInDirectory(const std::string& path) {

    DIR *dir = nullptr;
    struct dirent *ent = nullptr;
    if ((dir = opendir(path.c_str())) != nullptr) {
      while ((ent = readdir(dir)) != nullptr) {
        std::string s = ent->d_name;
	if (s.length() > 4 && s.substr(s.length() - 4, 4) == ".bin") {
	  s = path + ent->d_name;
	  FILE *fin = fopen(s.c_str(), "rb");
	  if (fin == nullptr) {
	    fprintf(stderr, "FATAL: %s: cannot open %s\n", __func__, s.c_str());
	    exit(EXIT_FAILURE);
	  }
	  int summaryCalcStreamType = 0;
	  fread(&summaryCalcStreamType, sizeof(summaryCalcStreamType), 1, fin);
	  if (summaryCalcStreamType != (summarycalc_id | 1)) {
	    fprintf(stderr, "FATAL: %s: invalid stream type %d\n", __func__,
		    summaryCalcStreamType);
	    exit(EXIT_FAILURE);
	  }
	  fread(&sampleSize_, sizeof(sampleSize_), 1, fin);
	  int summarySet = 0;
	  fread(&summarySet, sizeof(summarySet), 1, fin);

	  ReadInputStream(fin);

	  fclose(fin);

	}

      }

    }

  }